

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree_helpers.c
# Opt level: O1

int kvtree_atod(char *str,double *val)

{
  uint __errnum;
  uint *puVar1;
  char *pcVar2;
  undefined8 uVar3;
  double dVar4;
  
  if (str == (char *)0x0) {
    pcVar2 = "kvtree_atod: Can\'t convert NULL string to double @ %s:%d";
    uVar3 = 0x23;
  }
  else {
    if (val != (double *)0x0) {
      puVar1 = (uint *)__errno_location();
      *puVar1 = 0;
      dVar4 = strtod(str,(char **)0x0);
      __errnum = *puVar1;
      if (__errnum != 0) {
        pcVar2 = strerror(__errnum);
        kvtree_err("kvtree_atod: Invalid double: %s errno=%d %s @ %s:%d",str,(ulong)__errnum,pcVar2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree_helpers.c"
                   ,0x39);
        return 1;
      }
      *val = dVar4;
      return 0;
    }
    pcVar2 = "kvtree_atod: NULL address to store value @ %s:%d";
    uVar3 = 0x2b;
  }
  kvtree_err(pcVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree_helpers.c"
             ,uVar3);
  return 1;
}

Assistant:

int kvtree_atod(char* str, double* val)
{
  /* check that we have a string */
  if (str == NULL) {
    kvtree_err("kvtree_atod: Can't convert NULL string to double @ %s:%d",
            __FILE__, __LINE__
    );
    return KVTREE_FAILURE;
  }

  /* check that we have a value to write to */
  if (val == NULL) {
    kvtree_err("kvtree_atod: NULL address to store value @ %s:%d",
            __FILE__, __LINE__
    );
    return KVTREE_FAILURE;
  }

  /* convert string to double */
  errno = 0;
  double value = strtod(str, NULL);
  if (errno == 0) {
    /* got a valid double, set our output parameter */
    *val = value;
  } else {
    /* could not interpret value */
    kvtree_err("kvtree_atod: Invalid double: %s errno=%d %s @ %s:%d",
            str, errno, strerror(errno), __FILE__, __LINE__
    );
    return KVTREE_FAILURE;
  }

  return KVTREE_SUCCESS;
}